

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormulaVarIterator.hpp
# Opt level: O2

VList * Kernel::freeVariables<Kernel::Term*>(Term *thing)

{
  List<unsigned_int> *pLVar1;
  bool bVar2;
  uint elem;
  FIFO result;
  FormulaVarIterator fvi;
  FIFO local_f8;
  FormulaVarIterator local_e8;
  
  FormulaVarIterator::FormulaVarIterator(&local_e8,thing);
  local_f8._first = (VList *)0x0;
  local_f8._last = (List<unsigned_int> *)0x0;
  while( true ) {
    bVar2 = FormulaVarIterator::hasNext(&local_e8);
    pLVar1 = local_f8._first;
    if (!bVar2) break;
    elem = FormulaVarIterator::next(&local_e8);
    Lib::List<unsigned_int>::FIFO::pushBack(&local_f8,elem);
  }
  FormulaVarIterator::~FormulaVarIterator(&local_e8);
  return pLVar1;
}

Assistant:

VList* freeVariables(T thing)
{
  FormulaVarIterator fvi(thing);
  VList::FIFO result;
  while (fvi.hasNext()) {
    result.pushBack(fvi.next());
  }
  return result.list();
}